

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O3

char * libssh2_session_hostkey(LIBSSH2_SESSION *session,size_t *len,int *type)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = session->server_hostkey_len;
  if ((ulong)uVar1 == 0) {
    if (len != (size_t *)0x0) {
      *len = 0;
    }
    plVar2 = (long *)0x0;
  }
  else {
    if (len != (size_t *)0x0) {
      *len = (ulong)uVar1;
    }
    plVar2 = (long *)session->server_hostkey;
    if (type != (int *)0x0) {
      iVar3 = 0;
      if (10 < uVar1) {
        if (*(long *)((long)plVar2 + 3) == 0x6173722d68737307 && *plVar2 == 0x2d68737307000000) {
          iVar3 = 1;
        }
        else if (*(long *)((long)plVar2 + 3) == 0x7373642d68737307 && *plVar2 == 0x2d68737307000000)
        {
          iVar3 = 2;
        }
        else {
          iVar3 = 0;
          if (0xe < uVar1) {
            if (*(long *)((long)plVar2 + 7) == 0x393135353264652d && *plVar2 == 0x2d6873730b000000)
            {
              iVar3 = 6;
            }
            else if (0x16 < uVar1) {
              auVar6[0] = -(*(char *)((long)plVar2 + 7) == 's');
              auVar6[1] = -((char)plVar2[1] == 'a');
              auVar6[2] = -(*(char *)((long)plVar2 + 9) == '-');
              auVar6[3] = -(*(char *)((long)plVar2 + 10) == 's');
              auVar6[4] = -(*(char *)((long)plVar2 + 0xb) == 'h');
              auVar6[5] = -(*(char *)((long)plVar2 + 0xc) == 'a');
              auVar6[6] = -(*(char *)((long)plVar2 + 0xd) == '2');
              auVar6[7] = -(*(char *)((long)plVar2 + 0xe) == '-');
              auVar6[8] = -(*(char *)((long)plVar2 + 0xf) == 'n');
              auVar6[9] = -((char)plVar2[2] == 'i');
              auVar6[10] = -(*(char *)((long)plVar2 + 0x11) == 's');
              auVar6[0xb] = -(*(char *)((long)plVar2 + 0x12) == 't');
              auVar6[0xc] = -(*(char *)((long)plVar2 + 0x13) == 'p');
              auVar6[0xd] = -(*(char *)((long)plVar2 + 0x14) == '2');
              auVar6[0xe] = -(*(char *)((long)plVar2 + 0x15) == '5');
              auVar6[0xf] = -(*(char *)((long)plVar2 + 0x16) == '6');
              auVar4[0] = -((char)*plVar2 == '\0');
              auVar4[1] = -(*(char *)((long)plVar2 + 1) == '\0');
              auVar4[2] = -(*(char *)((long)plVar2 + 2) == '\0');
              auVar4[3] = -(*(char *)((long)plVar2 + 3) == '\x13');
              auVar4[4] = -(*(char *)((long)plVar2 + 4) == 'e');
              auVar4[5] = -(*(char *)((long)plVar2 + 5) == 'c');
              auVar4[6] = -(*(char *)((long)plVar2 + 6) == 'd');
              auVar4[7] = -(*(char *)((long)plVar2 + 7) == 's');
              auVar4[8] = -((char)plVar2[1] == 'a');
              auVar4[9] = -(*(char *)((long)plVar2 + 9) == '-');
              auVar4[10] = -(*(char *)((long)plVar2 + 10) == 's');
              auVar4[0xb] = -(*(char *)((long)plVar2 + 0xb) == 'h');
              auVar4[0xc] = -(*(char *)((long)plVar2 + 0xc) == 'a');
              auVar4[0xd] = -(*(char *)((long)plVar2 + 0xd) == '2');
              auVar4[0xe] = -(*(char *)((long)plVar2 + 0xe) == '-');
              auVar4[0xf] = -(*(char *)((long)plVar2 + 0xf) == 'n');
              auVar4 = auVar4 & auVar6;
              if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
                iVar3 = 3;
              }
              else {
                auVar8[0] = -(*(char *)((long)plVar2 + 7) == 's');
                auVar8[1] = -((char)plVar2[1] == 'a');
                auVar8[2] = -(*(char *)((long)plVar2 + 9) == '-');
                auVar8[3] = -(*(char *)((long)plVar2 + 10) == 's');
                auVar8[4] = -(*(char *)((long)plVar2 + 0xb) == 'h');
                auVar8[5] = -(*(char *)((long)plVar2 + 0xc) == 'a');
                auVar8[6] = -(*(char *)((long)plVar2 + 0xd) == '2');
                auVar8[7] = -(*(char *)((long)plVar2 + 0xe) == '-');
                auVar8[8] = -(*(char *)((long)plVar2 + 0xf) == 'n');
                auVar8[9] = -((char)plVar2[2] == 'i');
                auVar8[10] = -(*(char *)((long)plVar2 + 0x11) == 's');
                auVar8[0xb] = -(*(char *)((long)plVar2 + 0x12) == 't');
                auVar8[0xc] = -(*(char *)((long)plVar2 + 0x13) == 'p');
                auVar8[0xd] = -(*(char *)((long)plVar2 + 0x14) == '3');
                auVar8[0xe] = -(*(char *)((long)plVar2 + 0x15) == '8');
                auVar8[0xf] = -(*(char *)((long)plVar2 + 0x16) == '4');
                auVar7[0] = -((char)*plVar2 == '\0');
                auVar7[1] = -(*(char *)((long)plVar2 + 1) == '\0');
                auVar7[2] = -(*(char *)((long)plVar2 + 2) == '\0');
                auVar7[3] = -(*(char *)((long)plVar2 + 3) == '\x13');
                auVar7[4] = -(*(char *)((long)plVar2 + 4) == 'e');
                auVar7[5] = -(*(char *)((long)plVar2 + 5) == 'c');
                auVar7[6] = -(*(char *)((long)plVar2 + 6) == 'd');
                auVar7[7] = -(*(char *)((long)plVar2 + 7) == 's');
                auVar7[8] = -((char)plVar2[1] == 'a');
                auVar7[9] = -(*(char *)((long)plVar2 + 9) == '-');
                auVar7[10] = -(*(char *)((long)plVar2 + 10) == 's');
                auVar7[0xb] = -(*(char *)((long)plVar2 + 0xb) == 'h');
                auVar7[0xc] = -(*(char *)((long)plVar2 + 0xc) == 'a');
                auVar7[0xd] = -(*(char *)((long)plVar2 + 0xd) == '2');
                auVar7[0xe] = -(*(char *)((long)plVar2 + 0xe) == '-');
                auVar7[0xf] = -(*(char *)((long)plVar2 + 0xf) == 'n');
                auVar8 = auVar8 & auVar7;
                if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
                  iVar3 = 4;
                }
                else {
                  auVar5[0] = -((char)*plVar2 == '\0');
                  auVar5[1] = -(*(char *)((long)plVar2 + 1) == '\0');
                  auVar5[2] = -(*(char *)((long)plVar2 + 2) == '\0');
                  auVar5[3] = -(*(char *)((long)plVar2 + 3) == '\x13');
                  auVar5[4] = -(*(char *)((long)plVar2 + 4) == 'e');
                  auVar5[5] = -(*(char *)((long)plVar2 + 5) == 'c');
                  auVar5[6] = -(*(char *)((long)plVar2 + 6) == 'd');
                  auVar5[7] = -(*(char *)((long)plVar2 + 7) == 's');
                  auVar5[8] = -((char)plVar2[1] == 'a');
                  auVar5[9] = -(*(char *)((long)plVar2 + 9) == '-');
                  auVar5[10] = -(*(char *)((long)plVar2 + 10) == 's');
                  auVar5[0xb] = -(*(char *)((long)plVar2 + 0xb) == 'h');
                  auVar5[0xc] = -(*(char *)((long)plVar2 + 0xc) == 'a');
                  auVar5[0xd] = -(*(char *)((long)plVar2 + 0xd) == '2');
                  auVar5[0xe] = -(*(char *)((long)plVar2 + 0xe) == '-');
                  auVar5[0xf] = -(*(char *)((long)plVar2 + 0xf) == 'n');
                  auVar9[0] = -(*(char *)((long)plVar2 + 7) == 's');
                  auVar9[1] = -((char)plVar2[1] == 'a');
                  auVar9[2] = -(*(char *)((long)plVar2 + 9) == '-');
                  auVar9[3] = -(*(char *)((long)plVar2 + 10) == 's');
                  auVar9[4] = -(*(char *)((long)plVar2 + 0xb) == 'h');
                  auVar9[5] = -(*(char *)((long)plVar2 + 0xc) == 'a');
                  auVar9[6] = -(*(char *)((long)plVar2 + 0xd) == '2');
                  auVar9[7] = -(*(char *)((long)plVar2 + 0xe) == '-');
                  auVar9[8] = -(*(char *)((long)plVar2 + 0xf) == 'n');
                  auVar9[9] = -((char)plVar2[2] == 'i');
                  auVar9[10] = -(*(char *)((long)plVar2 + 0x11) == 's');
                  auVar9[0xb] = -(*(char *)((long)plVar2 + 0x12) == 't');
                  auVar9[0xc] = -(*(char *)((long)plVar2 + 0x13) == 'p');
                  auVar9[0xd] = -(*(char *)((long)plVar2 + 0x14) == '5');
                  auVar9[0xe] = -(*(char *)((long)plVar2 + 0x15) == '2');
                  auVar9[0xf] = -(*(char *)((long)plVar2 + 0x16) == '1');
                  auVar9 = auVar9 & auVar5;
                  iVar3 = (uint)((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                                         (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) * 5;
                }
              }
            }
          }
        }
      }
      *type = iVar3;
      return (char *)plVar2;
    }
  }
  return (char *)plVar2;
}

Assistant:

LIBSSH2_API const char *
libssh2_session_hostkey(LIBSSH2_SESSION *session, size_t *len, int *type)
{
    if(session->server_hostkey_len) {
        if(len)
            *len = session->server_hostkey_len;
        if(type)
            *type = hostkey_type(session->server_hostkey,
                                 session->server_hostkey_len);
        return (char *) session->server_hostkey;
    }
    if(len)
        *len = 0;
    return NULL;
}